

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

void Nwk_ManDelayTracePrint(Nwk_Man_t *pNtk)

{
  int *piVar1;
  If_LibLut_t *pIVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  void *__s;
  void *pvVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  pIVar2 = pNtk->pLutLib;
  if (pIVar2 == (If_LibLut_t *)0x0) {
    iVar8 = Nwk_ManLevelMax(pNtk);
    fVar13 = (float)iVar8;
  }
  else {
    iVar8 = pIVar2->LutMax;
    iVar4 = Nwk_ManGetFaninMax(pNtk);
    if (iVar8 < iVar4) {
      uVar9 = pIVar2->LutMax;
      uVar5 = Nwk_ManGetFaninMax(pNtk);
      printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar9,
             (ulong)uVar5);
      return;
    }
    fVar13 = 20.0;
  }
  fVar15 = fVar13 + 1.0;
  __s = malloc(((long)fVar15 >> 0x3f & (long)(fVar15 - 9.223372e+18) | (long)fVar15) << 2);
  uVar7 = (ulong)(fVar15 * 4.0);
  iVar8 = 0;
  memset(__s,0,(long)uVar7 >> 0x3f & (long)(fVar15 * 4.0 - 9.223372e+18) | uVar7);
  fVar15 = Nwk_ManDelayTraceLut(pNtk);
  do {
    if (pNtk->vObjs->nSize <= iVar8) {
      pcVar10 = "LUT library";
      if (pIVar2 == (If_LibLut_t *)0x0) {
        pcVar10 = "unit-delay";
      }
      pcVar12 = "%";
      if (pIVar2 == (If_LibLut_t *)0x0) {
        pcVar12 = "lev";
      }
      printf("Max delay = %6.2f. Delay trace using %s model:\n",(double)fVar15,pcVar10);
      uVar11 = 0;
      uVar7 = 5;
      uVar9 = 0;
      while ((float)(int)uVar11 < fVar13) {
        uVar9 = uVar9 + *(int *)((long)__s + uVar11 * 4);
        uVar11 = uVar11 + 1;
        uVar3 = uVar7;
        if (pIVar2 == (If_LibLut_t *)0x0) {
          uVar3 = uVar11;
        }
        printf("%3d %s : %5d  (%6.2f %%)\n",((double)(int)uVar9 * 100.0) / (double)pNtk->nObjs[3],
               uVar3 & 0xffffffff,pcVar12,(ulong)uVar9);
        uVar7 = (ulong)((int)uVar7 + 5);
      }
      free(__s);
      return;
    }
    pvVar6 = Vec_PtrEntry(pNtk->vObjs,iVar8);
    if ((((pvVar6 != (void *)0x0) && ((*(uint *)((long)pvVar6 + 0x20) & 7) == 3)) &&
        (*(int *)((long)pvVar6 + 0x3c) != 0)) &&
       (fVar14 = *(float *)((long)pvVar6 + 0x38) / (fVar15 / fVar13), fVar14 <= fVar13)) {
      if ((fVar14 < 0.0) || (fVar13 < fVar14)) {
        __assert_fail("Num >=0 && Num <= nSteps",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                      ,0x1e7,"void Nwk_ManDelayTracePrint(Nwk_Man_t *)");
      }
      piVar1 = (int *)((long)__s + (long)(int)fVar14 * 4);
      *piVar1 = *piVar1 + 1;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void Nwk_ManDelayTracePrint( Nwk_Man_t * pNtk )
{
    If_LibLut_t * pLutLib = pNtk->pLutLib;
    Nwk_Obj_t * pNode;
    int i, Nodes, * pCounters;
    float tArrival, tDelta, nSteps, Num;
    // get the library
    if ( pLutLib && pLutLib->LutMax < Nwk_ManGetFaninMax(pNtk) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Nwk_ManGetFaninMax(pNtk) );
        return;
    }
    // decide how many steps
    nSteps = pLutLib ? 20 : Nwk_ManLevelMax(pNtk);
    pCounters = ABC_ALLOC( int, nSteps + 1 );
    memset( pCounters, 0, sizeof(int)*(nSteps + 1) );
    // perform delay trace
    tArrival = Nwk_ManDelayTraceLut( pNtk );
    tDelta = tArrival / nSteps;
    // count how many nodes have slack in the corresponding intervals
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        if ( Nwk_ObjFaninNum(pNode) == 0 )
            continue;
        Num = Nwk_ObjSlack(pNode) / tDelta;
        if ( Num > nSteps )
            continue;
        assert( Num >=0 && Num <= nSteps );
        pCounters[(int)Num]++;
    }
    // print the results
    printf( "Max delay = %6.2f. Delay trace using %s model:\n", tArrival, pLutLib? "LUT library" : "unit-delay" );
    Nodes = 0;
    for ( i = 0; i < nSteps; i++ )
    {
        Nodes += pCounters[i];
        printf( "%3d %s : %5d  (%6.2f %%)\n", pLutLib? 5*(i+1) : i+1, 
            pLutLib? "%":"lev", Nodes, 100.0*Nodes/Nwk_ManNodeNum(pNtk) );
    }
    ABC_FREE( pCounters );
}